

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall directory::directory(directory *this,string *typeName)

{
  _Ios_Openmode _Var1;
  size_t in_RCX;
  void *__buf;
  string local_258 [32];
  undefined1 local_238 [8];
  fstream directoryFile;
  string *typeName_local;
  directory *this_local;
  
  this->depth = 1;
  this->bucket_size = 2;
  std::__cxx11::string::string((string *)&this->typeName);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->bucket_ids);
  std::__cxx11::string::operator=((string *)&this->typeName,(string *)typeName);
  generateDirectoryFileName(local_258);
  _Var1 = std::operator|(_S_in,_S_out);
  _Var1 = std::operator|(_Var1,_S_bin);
  std::fstream::fstream(local_238,(string *)local_258,_Var1);
  std::__cxx11::string::~string((string *)local_258);
  read(this,(int)local_238,__buf,in_RCX);
  std::fstream::~fstream(local_238);
  return;
}

Assistant:

directory::directory(std::string typeName) {

    this->typeName = typeName;

    fstream directoryFile(generateDirectoryFileName(typeName), INOUTBIN);

    this->read(directoryFile);
}